

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall XPMP2::Aircraft::SoundRemoveAll(Aircraft *this)

{
  uint uVar1;
  bool bVar2;
  reference puVar3;
  long *in_RDI;
  SndChTy *sndChn;
  SndChTy *__end1_1;
  SndChTy *__begin1_1;
  SndChTy (*__range1_1) [5];
  uint64_t sndId;
  iterator __end1;
  iterator __begin1;
  ChnListTy *__range1;
  list<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  list<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff70;
  long *local_68;
  _Self local_50;
  _Self local_48;
  long *local_40;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  if (gpSndSys != (long *)0x0) {
    bVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x65));
    if (((!bVar2) && ((DAT_0047da44 & 1) != 0)) && (glob < 1)) {
      uVar1 = *(uint *)(in_RDI + 1);
      in_stack_ffffffffffffff70 = &local_28;
      (**(code **)(*in_RDI + 0x10))();
      in_stack_ffffffffffffff68 =
           (list<unsigned_long,_std::allocator<unsigned_long>_> *)std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x3be,"SoundRemoveAll",logDEBUG,"Aircraft %08X (%s): Removed all sounds",(ulong)uVar1)
      ;
      std::__cxx11::string::~string((string *)&local_28);
    }
    local_40 = in_RDI + 0x65;
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_ffffffffffffff68);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                   (in_stack_ffffffffffffff68);
    while (bVar2 = std::operator!=(&local_48,&local_50), bVar2) {
      puVar3 = std::_List_iterator<unsigned_long>::operator*
                         ((_List_iterator<unsigned_long> *)0x36bd2a);
      (**(code **)(*gpSndSys + 0x28))(gpSndSys,*puVar3);
      std::_List_iterator<unsigned_long>::operator++(&local_48);
    }
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
              (in_stack_ffffffffffffff70);
    for (local_68 = in_RDI + 0x55; local_68 != in_RDI + 100; local_68 = local_68 + 3) {
      local_68[1] = 0;
    }
  }
  return;
}

Assistant:

void Aircraft::SoundRemoveAll ()
{
    if (!gpSndSys) return;

    // Log a message only if there actually is anything to stop
    if (!chnList.empty()) {
        LOG_MATCHING(logDEBUG, "Aircraft %08X (%s): Removed all sounds",
                     modeS_id, GetFlightId().c_str());
    }

    // All channels now to be stopped
    for (uint64_t sndId: chnList) gpSndSys->Stop(sndId);
    chnList.clear();
    for (SndChTy &sndChn: aSndCh) sndChn.chnId = 0;
}